

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<capnp::_::(anonymous_namespace)::UnionState&>
          (String *__return_storage_ptr__,kj *this,UnionState *params)

{
  char *in_RCX;
  char (*in_stack_ffffffffffffffb8) [2];
  size_t sStack_40;
  ArrayDisposer *local_38;
  String local_30;
  
  strArray<unsigned_int_const(&)[4]>
            ((String *)&stack0xffffffffffffffb8,this,(uint (*) [4])0x2c3574,in_RCX);
  str<char_const(&)[13],kj::String,char_const(&)[4],int_const&,char_const(&)[2]>
            (&local_30,(kj *)"UnionState({",(char (*) [13])&stack0xffffffffffffffb8,(String *)"}, ",
             (char (*) [4])(this + 0x10),(int *)0x2c995d,in_stack_ffffffffffffffb8);
  if (in_stack_ffffffffffffffb8 != (char (*) [2])0x0) {
    (*(code *)**(undefined8 **)local_38)(local_38,in_stack_ffffffffffffffb8,1,sStack_40,sStack_40,0)
    ;
  }
  (__return_storage_ptr__->content).ptr = local_30.content.ptr;
  (__return_storage_ptr__->content).size_ = local_30.content.size_;
  (__return_storage_ptr__->content).disposer = local_30.content.disposer;
  return (String *)local_30.content.disposer;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}